

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.cpp
# Opt level: O1

void Assimp::IFC::ConvertVector(IfcVector3 *out,IfcVector *in)

{
  double dVar1;
  IfcDirection *in_00;
  
  in_00 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcDirection>
                    (*(LazyObject **)&(in->super_IfcGeometricRepresentationItem).field_0x30);
  ConvertDirection(out,in_00);
  dVar1 = in->Magnitude;
  out->x = out->x * dVar1;
  out->y = out->y * dVar1;
  out->z = dVar1 * out->z;
  return;
}

Assistant:

void ConvertVector(IfcVector3& out, const Schema_2x3::IfcVector& in)
{
    ConvertDirection(out,in.Orientation);
    out *= in.Magnitude;
}